

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkViewport * __thiscall
Fossilize::StateRecorder::Impl::copy<VkViewport>
          (Impl *this,VkViewport *src,size_t count,ScratchAllocator *alloc)

{
  VkViewport *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkViewport>(alloc,count);
    if (pVVar1 != (VkViewport *)0x0) {
      pVVar1 = (VkViewport *)memmove(pVVar1,src,count * 0x18);
      return pVVar1;
    }
  }
  return (VkViewport *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}